

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O2

RegSP snap_renameref(GCtrace *T,SnapNo lim,IRRef ref,RegSP rs)

{
  IRRef1 *pIVar1;
  
  for (pIVar1 = &(&T->ir->field_0)[T->nins - 1].prev; *(char *)((long)pIVar1 + -1) == '\x14';
      pIVar1 = pIVar1 + -4) {
    if ((((anon_struct_8_4_c535eab0_for_IRIns_0 *)(pIVar1 + -3))->op1 == ref) && (pIVar1[-2] <= lim)
       ) {
      rs = (RegSP)*pIVar1;
    }
  }
  return rs;
}

Assistant:

static RegSP snap_renameref(GCtrace *T, SnapNo lim, IRRef ref, RegSP rs)
{
  IRIns *ir;
  for (ir = &T->ir[T->nins-1]; ir->o == IR_RENAME; ir--)
    if (ir->op1 == ref && ir->op2 <= lim)
      rs = ir->prev;
  return rs;
}